

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgramChain.cpp
# Opt level: O2

void __thiscall BamTools::SamProgramChain::Add(SamProgramChain *this,SamProgram *program)

{
  bool bVar1;
  string local_40;
  
  bVar1 = Contains(this,&program->ID);
  if (!bVar1) {
    if ((this->m_data).
        super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->m_data).
        super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      NextIdFor(&local_40,this,&program->ID);
      std::__cxx11::string::_M_assign((string *)&program->NextProgramID);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>::push_back
              (&this->m_data,program);
  }
  return;
}

Assistant:

void SamProgramChain::Add(SamProgram& program)
{

    // ignore duplicated records
    if (Contains(program)) {
        return;
    }

    // if other programs already in chain, try to find the "next" record
    // tries to match another record's PPID with @program's ID
    if (!IsEmpty()) {
        program.NextProgramID = NextIdFor(program.ID);
    }

    // store program record
    m_data.push_back(program);
}